

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ConsumeInteger64
          (Parser *this,uint64 max_value,uint64 *output,char *error)

{
  TokenType TVar1;
  bool bVar2;
  string local_48;
  allocator local_21;
  
  TVar1 = (this->input_->current_).type;
  if (TVar1 == TYPE_INTEGER) {
    bVar2 = io::Tokenizer::ParseInteger(&(this->input_->current_).text,max_value,output);
    if (!bVar2) {
      std::__cxx11::string::string((string *)&local_48,"Integer out of range.",&local_21);
      AddError(this,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      *output = 0;
    }
    io::Tokenizer::Next(this->input_);
  }
  else {
    std::__cxx11::string::string((string *)&local_48,error,&local_21);
    AddError(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return TVar1 == TYPE_INTEGER;
}

Assistant:

bool Parser::ConsumeInteger64(uint64 max_value, uint64* output,
                              const char* error) {
  if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
    if (!io::Tokenizer::ParseInteger(input_->current().text, max_value,
                                     output)) {
      AddError("Integer out of range.");
      // We still return true because we did, in fact, parse an integer.
      *output = 0;
    }
    input_->Next();
    return true;
  } else {
    AddError(error);
    return false;
  }
}